

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

void write_file(path *path,string *data)

{
  int iVar1;
  value_type *pvVar2;
  ContextManager *pCVar3;
  void *__buf;
  size_t __n;
  ssize_t sVar4;
  long lVar5;
  long lVar6;
  string local_90;
  string local_70;
  int local_50;
  int cnt;
  string local_40;
  int local_1c;
  string *psStack_18;
  fd_t fd;
  string *data_local;
  path *path_local;
  
  psStack_18 = data;
  data_local = (string *)path;
  pvVar2 = std::filesystem::__cxx11::path::c_str(path);
  local_1c = open(pvVar2,1);
  if (local_1c < 0) {
    pCVar3 = ContextManager::get();
    pvVar2 = std::filesystem::__cxx11::path::c_str((path *)data_local);
    format_abi_cxx11_(&local_40,"Cannot open file \'%s\' for writing: %m",pvVar2);
    (*(code *)**(undefined8 **)pCVar3)(pCVar3,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  iVar1 = local_1c;
  __buf = (void *)std::__cxx11::string::c_str();
  __n = std::__cxx11::string::size();
  sVar4 = write(iVar1,__buf,__n);
  local_50 = (int)sVar4;
  if (-1 < local_50) {
    lVar5 = (long)local_50;
    lVar6 = std::__cxx11::string::size();
    if (lVar5 == lVar6) goto LAB_001632c3;
  }
  pCVar3 = ContextManager::get();
  pvVar2 = std::filesystem::__cxx11::path::c_str((path *)data_local);
  format_abi_cxx11_(&local_70,"Cannot write to file \'%s\': %m",pvVar2);
  (*(code *)**(undefined8 **)pCVar3)(pCVar3,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
LAB_001632c3:
  iVar1 = close(local_1c);
  if (iVar1 != 0) {
    pCVar3 = ContextManager::get();
    pvVar2 = std::filesystem::__cxx11::path::c_str((path *)data_local);
    format_abi_cxx11_(&local_90,"Cannot close file \'%s\': %m",pvVar2);
    (*(code *)**(undefined8 **)pCVar3)(pCVar3,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  }
  return;
}

Assistant:

void write_file(const fs::path &path, const std::string &data) {
    fd_t fd = open(path.c_str(), O_WRONLY);
    if (fd < 0) {
        die(format("Cannot open file '%s' for writing: %m", path.c_str()));
    }
    int cnt = write(fd, data.c_str(), data.size());
    if (cnt < 0 || static_cast<size_t>(cnt) != data.size()) {
        die(format("Cannot write to file '%s': %m", path.c_str()));
    }
    if (close(fd) != 0) {
        die(format("Cannot close file '%s': %m", path.c_str()));
    }
}